

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::SetIntegrationRule
          (TPZCompElWithMem<TPZInterfaceElement> *this,int ord)

{
  int iVar1;
  TPZIntPoints *pTVar2;
  
  std::operator<<((ostream *)&std::cout,"TPZCompEl::SetIntegrationRule should not be called\n");
  pTVar2 = TPZCompEl::GetIntegrationRule((TPZCompEl *)this);
  iVar1 = (*pTVar2->_vptr_TPZIntPoints[3])(pTVar2);
  if ((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements ==
      (long)iVar1) {
    return;
  }
  (**(code **)(*(long *)&(this->super_TPZInterfaceElement).super_TPZCompEl + 0x178))(this);
  (**(code **)(*(long *)&(this->super_TPZInterfaceElement).super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}